

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O3

QDebug operator<<(QDebug debug,GraphicsItemFlags flags)

{
  bool bVar1;
  uint in_EDX;
  undefined4 in_register_00000034;
  undefined8 *puVar2;
  QTextStream *pQVar3;
  int i;
  int iVar4;
  long in_FS_OFFSET;
  QDebug local_48;
  undefined1 local_40 [8];
  long local_38;
  
  puVar2 = (undefined8 *)
           CONCAT44(in_register_00000034,
                    flags.super_QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4>.
                    super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QTextStream::operator<<((QTextStream *)*puVar2,'(');
  if (((QTextStream *)*puVar2)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)*puVar2,' ');
  }
  iVar4 = 0;
  bVar1 = false;
  do {
    if ((1 << ((byte)iVar4 & 0x1f) & in_EDX) != 0) {
      pQVar3 = (QTextStream *)*puVar2;
      if (bVar1) {
        QTextStream::operator<<(pQVar3,'|');
        pQVar3 = (QTextStream *)*puVar2;
        if (pQVar3[0x30] == (QTextStream)0x1) {
          QTextStream::operator<<(pQVar3,' ');
          pQVar3 = (QTextStream *)*puVar2;
        }
      }
      *(int *)(pQVar3 + 0x28) = *(int *)(pQVar3 + 0x28) + 1;
      local_48.stream = (Stream *)pQVar3;
      operator<<((Stream *)local_40,(GraphicsItemFlag)&local_48);
      QDebug::~QDebug((QDebug *)local_40);
      QDebug::~QDebug(&local_48);
      bVar1 = true;
    }
    iVar4 = iVar4 + 1;
  } while (iVar4 != 0x11);
  QTextStream::operator<<((QTextStream *)*puVar2,')');
  pQVar3 = (QTextStream *)*puVar2;
  if (pQVar3[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar3,' ');
    pQVar3 = (QTextStream *)*puVar2;
  }
  *puVar2 = 0;
  *(QTextStream **)debug.stream = pQVar3;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, QGraphicsItem::GraphicsItemFlags flags)
{
    debug << '(';
    bool f = false;
    for (int i = 0; i < 17; ++i) {
        if (flags & (1 << i)) {
            if (f)
                debug << '|';
            f = true;
            debug << QGraphicsItem::GraphicsItemFlag(int(flags & (1 << i)));
        }
    }
    debug << ')';
    return debug;
}